

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O0

void __thiscall xmrig::NetworkState::add(NetworkState *this,SubmitResult *result,char *error)

{
  value_type_conflict4 vVar1;
  reference pvVar2;
  long in_RDX;
  long in_RSI;
  reverse_iterator<unsigned_long_*> *in_RDI;
  size_t ln;
  value_type_conflict5 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar3;
  array<unsigned_long,_10UL> *in_stack_ffffffffffffffa8;
  reverse_iterator<unsigned_long_*> *__last;
  
  if (in_RDX == 0) {
    in_RDI[0x2a].current = (unsigned_long *)((long)in_RDI[0x2a].current + 1);
    in_RDI[0x2e].current = (unsigned_long *)(*(long *)(in_RSI + 0x20) + (long)in_RDI[0x2e].current);
    std::array<unsigned_long,_10UL>::size((array<unsigned_long,_10UL> *)(in_RDI + 0x20));
    __last = *(reverse_iterator<unsigned_long_*> **)(in_RSI + 0x18);
    pvVar2 = std::array<unsigned_long,_10UL>::operator[]
                       ((array<unsigned_long,_10UL> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (size_type)in_stack_ffffffffffffff98);
    if ((reverse_iterator<unsigned_long_*> *)*pvVar2 < __last) {
      vVar1 = *(value_type_conflict4 *)(in_RSI + 0x18);
      pvVar2 = std::array<unsigned_long,_10UL>::operator[]
                         ((array<unsigned_long,_10UL> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (size_type)in_stack_ffffffffffffff98);
      *pvVar2 = vVar1;
      std::array<unsigned_long,_10UL>::rbegin(in_stack_ffffffffffffffa8);
      std::array<unsigned_long,_10UL>::rend(in_stack_ffffffffffffffa8);
      std::sort<std::reverse_iterator<unsigned_long*>>(in_RDI,__last);
    }
    if (*(ulong *)(in_RSI + 0x28) < 0x10000) {
      uVar3 = (uint)*(undefined8 *)(in_RSI + 0x28) & 0xffff;
    }
    else {
      uVar3 = 0xffff;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  }
  else {
    in_RDI[0x2d].current = (unsigned_long *)((long)in_RDI[0x2d].current + 1);
  }
  return;
}

Assistant:

void xmrig::NetworkState::add(const SubmitResult &result, const char *error)
{
    if (error) {
        rejected++;
        return;
    }

    accepted++;
    total += result.diff;

    const size_t ln = topDiff.size() - 1;
    if (result.actualDiff > topDiff[ln]) {
        topDiff[ln] = result.actualDiff;
        std::sort(topDiff.rbegin(), topDiff.rend());
    }

    m_latency.push_back(result.elapsed > 0xFFFF ? 0xFFFF : static_cast<uint16_t>(result.elapsed));
}